

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

void __thiscall
spvtools::opt::CopyPropagateArrays::UpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,Instruction *new_ptr_inst)

{
  char cVar1;
  Analysis AVar2;
  Op OVar3;
  Instruction *this_00;
  pointer pOVar4;
  DefUseManager *this_01;
  ConstantManager *this_02;
  bool bVar5;
  CommonDebugInfoInstructions CVar6;
  array<signed_char,_4UL> aVar7;
  array<signed_char,_4UL> aVar8;
  array<signed_char,_4UL> aVar9;
  array<signed_char,_4UL> aVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  array<signed_char,_4UL> aVar13;
  _Type acVar14;
  array<signed_char,_4UL> aVar15;
  StorageClass storage_class;
  _Type acVar16;
  PodType PVar17;
  array<signed_char,_4UL> aVar18;
  Instruction *pIVar19;
  const_iterator cVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  IRContext *pIVar25;
  undefined8 *puVar26;
  uint uVar27;
  IRContext *this_03;
  undefined8 *puVar28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_chain;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  _Any_data local_c0;
  PodType local_b0;
  PodType PStack_ac;
  _Invoker_type local_a8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a0;
  Instruction *local_98;
  undefined8 *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  DefUseManager *local_68;
  ConstantManager *local_60;
  Instruction *local_58;
  TypeManager *local_50;
  undefined8 *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  pIVar25 = (this->super_MemPass).super_Pass.context_;
  AVar2 = pIVar25->valid_analyses_;
  this_03 = pIVar25;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(pIVar25);
    this_03 = (this->super_MemPass).super_Pass.context_;
    AVar2 = this_03->valid_analyses_;
  }
  local_50 = (pIVar25->type_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pIVar25 = this_03;
  if ((AVar2 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(this_03);
    pIVar25 = (this->super_MemPass).super_Pass.context_;
    AVar2 = pIVar25->valid_analyses_;
  }
  local_60 = (this_03->constant_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar25);
  }
  local_68 = (pIVar25->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_c0._M_unused._M_object = &local_48;
  local_38 = 0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:645:27)>
             ::_M_invoke;
  _local_b0 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:645:27)>
              ::_M_manager;
  analysis::DefUseManager::ForEachUse
            (local_68,original_ptr_inst,
             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_c0);
  if ((PodType  [2])_local_b0 != (PodType  [2])0x0) {
    (*_local_b0)(&local_c0,&local_c0,3);
  }
  if (local_48 != puStack_40) {
    local_60 = (ConstantManager *)&local_60->id_to_const_val_;
    local_90 = puStack_40;
    puVar26 = local_48;
    puVar28 = puStack_40;
    local_98 = new_ptr_inst;
    local_58 = original_ptr_inst;
    do {
      this_00 = (Instruction *)*puVar26;
      uVar27 = *(uint *)(puVar26 + 1);
      uVar21 = (ulong)uVar27;
      CVar6 = Instruction::GetCommonDebugOpcode(this_00);
      if (CVar6 != CommonDebugInfoInstructionsMax) {
        CVar6 = Instruction::GetCommonDebugOpcode(this_00);
        if (CVar6 != CommonDebugInfoDebugValue) {
          if (CVar6 != CommonDebugInfoDebugDeclare) {
            __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                          ,0x2b3,
                          "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                         );
          }
          if ((new_ptr_inst->opcode_ != OpVariable) &&
             (new_ptr_inst->opcode_ != OpFunctionParameter)) {
            IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
            uVar22 = (ulong)(uVar27 - 2);
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            local_a8 = (_Invoker_type)&local_b0;
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b0.data._M_elems = (array<signed_char,_4UL>)0x1d;
            local_c0._8_8_ = 1;
            pOVar4 = (this_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar23 = ((long)(this_00->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar23 < uVar22 || uVar23 - uVar22 == 0) goto LAB_005874b6;
            uVar24 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar24 = (uint)this_00->has_result_id_;
            }
            if (uVar27 - 2 < uVar24) goto LAB_005874d5;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar22].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0._M_head_impl);
            }
            aVar13._M_elems[0] = '\0';
            aVar13._M_elems[1] = '\0';
            aVar13._M_elems[2] = '\0';
            aVar13._M_elems[3] = '\0';
            if (new_ptr_inst->has_result_id_ == true) {
              aVar13._M_elems =
                   (_Type)Instruction::GetSingleWordOperand
                                    (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
            }
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            local_a8 = (_Invoker_type)&local_b0;
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b0.data._M_elems =
                 (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar13._M_elems;
            local_c0._8_8_ = 1;
            pOVar4 = (this_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = ((long)(this_00->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
            uVar24 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar24 = (uint)this_00->has_result_id_;
            }
            if (uVar27 < uVar24) goto LAB_005874d5;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0._M_head_impl);
            }
            uVar27 = uVar27 + 1;
            uVar11 = Instruction::GetSingleWordOperand(this_00,uVar27);
            pIVar19 = analysis::DefUseManager::GetDef(local_68,uVar11);
            pIVar25 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar25->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
              IRContext::BuildDebugInfoManager(pIVar25);
            }
            pIVar19 = analysis::DebugInfoManager::DerefDebugExpression
                                ((pIVar25->debug_info_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                 ._M_head_impl,pIVar19);
            aVar9._M_elems[0] = '\0';
            aVar9._M_elems[1] = '\0';
            aVar9._M_elems[2] = '\0';
            aVar9._M_elems[3] = '\0';
            if (pIVar19->has_result_id_ == true) {
              aVar9._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
            }
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            local_a8 = (_Invoker_type)&local_b0;
            local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b0.data._M_elems =
                 (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar9._M_elems;
            local_c0._8_8_ = 1;
            uVar21 = (ulong)uVar27;
            pOVar4 = (this_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = ((long)(this_00->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
            uVar24 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar24 = (uint)this_00->has_result_id_;
            }
            if (uVar27 < uVar24) goto LAB_005874d5;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
            new_ptr_inst = local_98;
            local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
            if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a0,local_a0._M_head_impl);
            }
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar19);
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
            puVar28 = local_90;
            goto LAB_00587315;
          }
        }
        goto switchD_005868a1_caseD_3c;
      }
      OVar3 = this_00->opcode_;
      switch(OVar3) {
      case OpLoad:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
        aVar7._M_elems[0] = '\0';
        aVar7._M_elems[1] = '\0';
        aVar7._M_elems[2] = '\0';
        aVar7._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar7._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        local_a8 = (_Invoker_type)&local_b0;
        local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar7._M_elems;
        local_c0._8_8_ = 1;
        pOVar4 = (this_00->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(this_00->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
        uVar24 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar24 = (uint)this_00->has_result_id_;
        }
        if (uVar27 < uVar24) goto LAB_005874d5;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a0,local_a0._M_head_impl);
        }
        aVar8._M_elems[0] = '\0';
        aVar8._M_elems[1] = '\0';
        aVar8._M_elems[2] = '\0';
        aVar8._M_elems[3] = '\0';
        uVar11 = 0;
        if (new_ptr_inst->has_type_id_ == true) {
          uVar11 = Instruction::GetSingleWordOperand(new_ptr_inst,0);
        }
        pIVar19 = analysis::DefUseManager::GetDef(local_68,uVar11);
        uVar27 = (pIVar19->has_result_id_ & 1) + 1;
        if (pIVar19->has_type_id_ == false) {
          uVar27 = (uint)pIVar19->has_result_id_;
        }
        PVar17.data._M_elems =
             (array<signed_char,_4UL>)Instruction::GetSingleWordOperand(pIVar19,uVar27 + 1);
        if (this_00->has_type_id_ == true) {
          aVar8._M_elems = (_Type)Instruction::GetSingleWordOperand(this_00,0);
        }
        puVar28 = local_90;
        if (PVar17.data._M_elems == (array<signed_char,_4UL>)aVar8._M_elems) {
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
          puVar28 = local_90;
        }
        else {
          if (this_00->has_type_id_ == false) goto LAB_00587532;
          if (PVar17.data._M_elems == (_Type)0x0) goto LAB_00587513;
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          local_a8 = (_Invoker_type)&local_b0;
          local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b0.data._M_elems = PVar17.data._M_elems;
          local_c0._8_8_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((this_00->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_c0);
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a0,local_a0._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
          UpdateUses(this,this_00,this_00);
        }
        new_ptr_inst = local_98;
        AddUsesToWorklist(this,this_00);
        break;
      case OpStore:
        if (uVar27 != 1) break;
        uVar11 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar11 = (uint)this_00->has_result_id_;
        }
        uVar11 = Instruction::GetSingleWordOperand(this_00,uVar11);
        pIVar19 = analysis::DefUseManager::GetDef(local_68,uVar11);
        uVar11 = 0;
        if (pIVar19->has_type_id_ == true) {
          uVar11 = Instruction::GetSingleWordOperand(pIVar19,0);
        }
        pIVar19 = analysis::DefUseManager::GetDef(local_68,uVar11);
        uVar27 = (pIVar19->has_result_id_ & 1) + 1;
        if (pIVar19->has_type_id_ == false) {
          uVar27 = (uint)pIVar19->has_result_id_;
        }
        uVar11 = Instruction::GetSingleWordOperand(pIVar19,uVar27 + 1);
        PVar17.data._M_elems =
             (array<signed_char,_4UL>)Pass::GenerateCopy((Pass *)this,local_58,uVar11,this_00);
        if (PVar17.data._M_elems == (_Type)0x0) {
          __assert_fail("copy != 0 && \"Should not be updating uses unless we know it can be done.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x329,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        local_a8 = (_Invoker_type)&local_b0;
        local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0.data._M_elems = PVar17.data._M_elems;
        local_c0._8_8_ = 1;
        uVar21 = (ulong)(this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar21 = (ulong)this_00->has_result_id_;
        }
        uVar21 = uVar21 + 1;
        pOVar4 = (this_00->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(this_00->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar4->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar21 * 0x30)),(SmallVector<unsigned_int,_2UL> *)&local_c0);
        puVar28 = local_90;
        goto joined_r0x00587223;
      case OpCopyMemory:
      case OpCopyMemorySized:
      case OpInBoundsAccessChain:
      case OpPtrAccessChain:
      case OpArrayLength:
      case OpGenericPtrMemSemantics:
      case OpInBoundsPtrAccessChain:
switchD_005868a1_caseD_3f:
        __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0x33b,
                      "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                     );
      case OpAccessChain:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
        aVar15._M_elems[0] = '\0';
        aVar15._M_elems[1] = '\0';
        aVar15._M_elems[2] = '\0';
        aVar15._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar15._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        this_02 = local_60;
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        local_a8 = (_Invoker_type)&local_b0;
        local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar15._M_elems;
        local_c0._8_8_ = 1;
        pOVar4 = (this_00->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(this_00->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
        uVar24 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar24 = (uint)this_00->has_result_id_;
        }
        if (uVar27 < uVar24) goto LAB_005874d5;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a0,local_a0._M_head_impl);
        }
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint32_t *)0x0;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint32_t *)0x0;
        uVar27 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar27 = (uint)this_00->has_result_id_;
        }
        if (1 < (int)((ulong)((long)(this_00->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar27) {
          uVar24 = 1;
          do {
            uVar11 = Instruction::GetSingleWordOperand(this_00,uVar27 + uVar24);
            local_c0._0_4_ = uVar11;
            cVar20 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this_02,(key_type *)local_c0._M_pod_data);
            if ((cVar20.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               (*(Constant **)
                 ((long)cVar20.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                        ._M_cur + 0x10) == (Constant *)0x0)) {
              local_c0._M_unused._M_member_pointer = (ulong)(uint)local_c0._4_4_ << 0x20;
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00586feb;
              *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
LAB_00586fe0:
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            else {
              local_c0._0_4_ =
                   analysis::Constant::GetU32
                             (*(Constant **)
                               ((long)cVar20.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                      ._M_cur + 0x10));
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_c0._0_4_;
                goto LAB_00586fe0;
              }
LAB_00586feb:
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_88,
                         (iterator)
                         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c0._M_pod_data);
            }
            uVar24 = uVar24 + 1;
            uVar27 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar27 = (uint)this_00->has_result_id_;
            }
          } while (uVar24 < (int)((ulong)((long)(this_00->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this_00->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                            -0x55555555 - uVar27);
        }
        pIVar25 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar25->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar25);
        }
        this_01 = (pIVar25->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        acVar16[0] = '\0';
        acVar16[1] = '\0';
        acVar16[2] = '\0';
        acVar16[3] = '\0';
        uVar11 = 0;
        if (local_98->has_type_id_ == true) {
          uVar11 = Instruction::GetSingleWordOperand(local_98,0);
        }
        pIVar19 = analysis::DefUseManager::GetDef(this_01,uVar11);
        uVar27 = (pIVar19->has_result_id_ & 1) + 1;
        if (pIVar19->has_type_id_ == false) {
          uVar27 = (uint)pIVar19->has_result_id_;
        }
        uVar11 = Instruction::GetSingleWordOperand(pIVar19,uVar27 + 1);
        uVar12 = GetMemberTypeId(this,uVar11,&local_88);
        uVar11 = (pIVar19->has_result_id_ & 1) + 1;
        if (pIVar19->has_type_id_ == false) {
          uVar11 = (uint)pIVar19->has_result_id_;
        }
        storage_class = Instruction::GetSingleWordOperand(pIVar19,uVar11);
        aVar13._M_elems =
             (_Type)analysis::TypeManager::FindPointerToType(local_50,uVar12,storage_class);
        if (this_00->has_type_id_ == true) {
          acVar16 = (_Type)Instruction::GetSingleWordOperand(this_00,0);
        }
        if (aVar13._M_elems == acVar16) {
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
          new_ptr_inst = local_98;
        }
        else {
          cVar1 = this_00->has_type_id_;
          new_ptr_inst = local_98;
joined_r0x005873de:
          local_98 = new_ptr_inst;
          if (cVar1 == '\0') {
LAB_00587532:
            __assert_fail("has_type_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          if (aVar13._M_elems == (_Type)0x0) {
LAB_00587513:
            __assert_fail("ty_id != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          local_a8 = (_Invoker_type)&local_b0;
          local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b0.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar13._M_elems
          ;
          local_c0._8_8_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((this_00->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_c0);
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a0,local_a0._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
          UpdateUses(this,this_00,this_00);
        }
LAB_0058745f:
        puVar28 = local_90;
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      default:
        if (OVar3 != OpExtInst) {
          if (OVar3 != OpCompositeExtract) goto switchD_005868a1_caseD_3f;
          IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
          aVar10._M_elems[0] = '\0';
          aVar10._M_elems[1] = '\0';
          aVar10._M_elems[2] = '\0';
          aVar10._M_elems[3] = '\0';
          if (new_ptr_inst->has_result_id_ == true) {
            aVar10._M_elems =
                 (_Type)Instruction::GetSingleWordOperand
                                  (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
          }
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          local_a8 = (_Invoker_type)&local_b0;
          local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b0.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar10._M_elems
          ;
          local_c0._8_8_ = 1;
          pOVar4 = (this_00->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar22 = ((long)(this_00->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                   -0x5555555555555555;
          if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_005874b6;
          uVar24 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar24 = (uint)this_00->has_result_id_;
          }
          if (uVar27 < uVar24) goto LAB_005874d5;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a0,local_a0._M_head_impl);
          }
          uVar11 = 0;
          if (local_98->has_type_id_ == true) {
            uVar11 = Instruction::GetSingleWordOperand(local_98,0);
          }
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint32_t *)0x0;
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint32_t *)0x0;
          uVar27 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar27 = (uint)this_00->has_result_id_;
          }
          if (1 < (int)((ulong)((long)(this_00->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - uVar27) {
            uVar24 = 1;
            do {
              uVar12 = Instruction::GetSingleWordOperand(this_00,uVar27 + uVar24);
              local_c0._0_4_ = uVar12;
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_88,
                           (iterator)
                           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c0._M_pod_data);
              }
              else {
                *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar12;
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar24 = uVar24 + 1;
              uVar27 = (this_00->has_result_id_ & 1) + 1;
              if (this_00->has_type_id_ == false) {
                uVar27 = (uint)this_00->has_result_id_;
              }
            } while (uVar24 < (int)((ulong)((long)(this_00->operands_).
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this_00->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x55555555 - uVar27);
          }
          aVar13._M_elems = (_Type)GetMemberTypeId(this,uVar11,&local_88);
          acVar14[0] = '\0';
          acVar14[1] = '\0';
          acVar14[2] = '\0';
          acVar14[3] = '\0';
          if (this_00->has_type_id_ == true) {
            acVar14 = (_Type)Instruction::GetSingleWordOperand(this_00,0);
          }
          new_ptr_inst = local_98;
          if (aVar13._M_elems != acVar14) {
            cVar1 = this_00->has_type_id_;
            goto joined_r0x005873de;
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
          goto LAB_0058745f;
        }
        bVar5 = IsInterpolationInstruction(this,this_00);
        if (!bVar5) {
          __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x2d5,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
      case OpImageTexelPointer:
      case OpDecorate:
switchD_005868a1_caseD_3c:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,this_00);
        aVar18._M_elems[0] = '\0';
        aVar18._M_elems[1] = '\0';
        aVar18._M_elems[2] = '\0';
        aVar18._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar18._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        local_a8 = (_Invoker_type)&local_b0;
        local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar18._M_elems;
        local_c0._8_8_ = 1;
        pOVar4 = (this_00->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(this_00->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
LAB_005874b6:
          local_a8 = (_Invoker_type)&local_b0;
          local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c0._8_8_ = 1;
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        uVar24 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar24 = (uint)this_00->has_result_id_;
        }
        if (uVar27 < uVar24) {
LAB_005874d5:
          local_a8 = (_Invoker_type)&local_b0;
          local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c0._8_8_ = 1;
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b9,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c0);
joined_r0x00587223:
        local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          local_c0._M_unused._M_object = &PTR__SmallVector_00930a20;
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a0,local_a0._M_head_impl);
        }
        IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,this_00);
      }
LAB_00587315:
      puVar26 = puVar26 + 2;
    } while (puVar26 != puVar28);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void CopyPropagateArrays::UpdateUses(Instruction* original_ptr_inst,
                                     Instruction* new_ptr_inst) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  std::vector<std::pair<Instruction*, uint32_t> > uses;
  def_use_mgr->ForEachUse(original_ptr_inst,
                          [&uses](Instruction* use, uint32_t index) {
                            uses.push_back({use, index});
                          });

  for (auto pair : uses) {
    Instruction* use = pair.first;
    uint32_t index = pair.second;

    if (use->IsCommonDebugInstr()) {
      switch (use->GetCommonDebugOpcode()) {
        case CommonDebugInfoDebugDeclare: {
          if (new_ptr_inst->opcode() == spv::Op::OpVariable ||
              new_ptr_inst->opcode() == spv::Op::OpFunctionParameter) {
            context()->ForgetUses(use);
            use->SetOperand(index, {new_ptr_inst->result_id()});
            context()->AnalyzeUses(use);
          } else {
            // Based on the spec, we cannot use a pointer other than OpVariable
            // or OpFunctionParameter for DebugDeclare. We have to use
            // DebugValue with Deref.

            context()->ForgetUses(use);

            // Change DebugDeclare to DebugValue.
            use->SetOperand(index - 2,
                            {static_cast<uint32_t>(CommonDebugInfoDebugValue)});
            use->SetOperand(index, {new_ptr_inst->result_id()});

            // Add Deref operation.
            Instruction* dbg_expr =
                def_use_mgr->GetDef(use->GetSingleWordOperand(index + 1));
            auto* deref_expr_instr =
                context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);
            use->SetOperand(index + 1, {deref_expr_instr->result_id()});

            context()->AnalyzeUses(deref_expr_instr);
            context()->AnalyzeUses(use);
          }
          break;
        }
        case CommonDebugInfoDebugValue:
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
          break;
        default:
          assert(false && "Don't know how to rewrite instruction");
          break;
      }
      continue;
    }

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Update the type.
        Instruction* pointer_type_inst =
            def_use_mgr->GetDef(new_ptr_inst->type_id());
        uint32_t new_type_id =
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx);
        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }

        AddUsesToWorklist(use);
      } break;
      case spv::Op::OpExtInst: {
        if (IsInterpolationInstruction(use)) {
          // Replace the actual use.
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
        } else {
          assert(false && "Don't know how to rewrite instruction");
        }
      } break;
      case spv::Op::OpAccessChain: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Convert the ids on the OpAccessChain to indices that can be used to
        // get the specific member.
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is an type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);
          }
        }

        Instruction* pointer_type_inst =
            get_def_use_mgr()->GetDef(new_ptr_inst->type_id());

        uint32_t new_pointee_type_id = GetMemberTypeId(
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx),
            access_chain);

        spv::StorageClass storage_class = static_cast<spv::StorageClass>(
            pointer_type_inst->GetSingleWordInOperand(
                kTypePointerStorageClassInIdx));

        uint32_t new_pointer_type_id =
            type_mgr->FindPointerToType(new_pointee_type_id, storage_class);

        if (new_pointer_type_id != use->type_id()) {
          use->SetResultType(new_pointer_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpCompositeExtract: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        uint32_t new_type_id = new_ptr_inst->type_id();
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        new_type_id = GetMemberTypeId(new_type_id, access_chain);

        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpStore:
        // If the use is the pointer, then it is the single store to that
        // variable.  We do not want to replace it.  Instead, it will become
        // dead after all of the loads are removed, and ADCE will get rid of it.
        //
        // If the use is the object being stored, we will create a copy of the
        // object turning it into the correct type. The copy is done by
        // decomposing the object into the base type, which must be the same,
        // and then rebuilding them.
        if (index == 1) {
          Instruction* target_pointer = def_use_mgr->GetDef(
              use->GetSingleWordInOperand(kStorePointerInOperand));
          Instruction* pointer_type =
              def_use_mgr->GetDef(target_pointer->type_id());
          uint32_t pointee_type_id =
              pointer_type->GetSingleWordInOperand(kTypePointerPointeeInIdx);
          uint32_t copy = GenerateCopy(original_ptr_inst, pointee_type_id, use);
          assert(copy != 0 &&
                 "Should not be updating uses unless we know it can be done.");

          context()->ForgetUses(use);
          use->SetInOperand(index, {copy});
          context()->AnalyzeUses(use);
        }
        break;
      case spv::Op::OpDecorate:
      // We treat an OpImageTexelPointer as a load.  The result type should
      // always have the Image storage class, and should not need to be
      // updated.
      case spv::Op::OpImageTexelPointer:
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});
        context()->AnalyzeUses(use);
        break;
      default:
        assert(false && "Don't know how to rewrite instruction");
        break;
    }
  }
}